

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void disas_system(DisasContext_conflict1 *s,uint32_t insn)

{
  uint32_t uVar1;
  uint32_t op0_00;
  uint32_t op1_00;
  uint32_t crn_00;
  uint32_t crm_00;
  uint32_t op2_00;
  uint32_t rt_00;
  uint rt;
  uint op2;
  uint crm;
  uint crn;
  uint op1;
  uint op0;
  uint l;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  uVar1 = extract32(insn,0x15,1);
  op0_00 = extract32(insn,0x13,2);
  op1_00 = extract32(insn,0x10,3);
  crn_00 = extract32(insn,0xc,4);
  crm_00 = extract32(insn,8,4);
  op2_00 = extract32(insn,5,3);
  rt_00 = extract32(insn,0,5);
  if (op0_00 == 0) {
    if ((uVar1 == 0) && (rt_00 == 0x1f)) {
      if (crn_00 == 2) {
        handle_hint(s,insn,op1_00,op2_00,crm_00);
      }
      else if (crn_00 == 3) {
        handle_sync(s,insn,op1_00,op2_00,crm_00);
      }
      else if (crn_00 == 4) {
        handle_msr_i(s,insn,op1_00,op2_00,crm_00);
      }
      else {
        unallocated_encoding_aarch64(s);
      }
    }
    else {
      unallocated_encoding_aarch64(s);
    }
  }
  else {
    handle_sys(s,insn,uVar1 != 0,op0_00,op1_00,op2_00,crn_00,crm_00,rt_00);
  }
  return;
}

Assistant:

static void disas_system(DisasContext *s, uint32_t insn)
{
    unsigned int l, op0, op1, crn, crm, op2, rt;
    l = extract32(insn, 21, 1);
    op0 = extract32(insn, 19, 2);
    op1 = extract32(insn, 16, 3);
    crn = extract32(insn, 12, 4);
    crm = extract32(insn, 8, 4);
    op2 = extract32(insn, 5, 3);
    rt = extract32(insn, 0, 5);

    if (op0 == 0) {
        if (l || rt != 31) {
            unallocated_encoding(s);
            return;
        }
        switch (crn) {
        case 2: /* HINT (including allocated hints like NOP, YIELD, etc) */
            handle_hint(s, insn, op1, op2, crm);
            break;
        case 3: /* CLREX, DSB, DMB, ISB */
            handle_sync(s, insn, op1, op2, crm);
            break;
        case 4: /* MSR (immediate) */
            handle_msr_i(s, insn, op1, op2, crm);
            break;
        default:
            unallocated_encoding(s);
            break;
        }
        return;
    }
    handle_sys(s, insn, l, op0, op1, op2, crn, crm, rt);
}